

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O1

void __thiscall bdNode::msgin_get_hash(bdNode *this,bdId *id,bdToken *transId,bdNodeId *info_hash)

{
  bdAccount::incCounter(&this->mAccount,4,false);
  queueQuery(this,id,info_hash,transId,3);
  return;
}

Assistant:

void bdNode::msgin_get_hash(bdId *id, bdToken *transId, bdNodeId *info_hash) {

	
#ifdef DEBUG_NODE_MSGIN
	std::cerr << "bdNode::msgin_get_hash() TransId: ";
	bdPrintTransId(std::cerr, transId);
	std::cerr << " From: ";
	mFns->bdPrintId(std::cerr, id);
	std::cerr << " InfoHash: ";
	mFns->bdPrintNodeId(std::cerr, info_hash);
	std::cerr << std::endl;
#endif


	mAccount.incCounter(BDACCOUNT_MSG_QUERYHASH, false);

	/* generate message, send to udp */
	queueQuery(id, info_hash, transId, BD_QUERY_HASH);

}